

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.h
# Opt level: O0

void __thiscall FIX::SessionSettings::SessionSettings(SessionSettings *this)

{
  SessionSettings *this_local;
  
  std::
  map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::map(&this->m_settings);
  Dictionary::Dictionary(&this->m_defaults);
  this->m_resolveEnvVars = false;
  return;
}

Assistant:

SessionSettings() { m_resolveEnvVars = false; }